

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O1

void testReadScans(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  ostream *in_RCX;
  char *pcVar5;
  char *pcVar6;
  char *unaff_R12;
  ostream *unaff_R14;
  pointer __old_p;
  ostream *unaff_R15;
  exr_context_t f;
  int32_t ccount;
  exr_attr_box2i_t dw;
  uint64_t pchunksz;
  exr_chunk_info_t cinfo;
  string fn;
  exr_context_initializer_t cinit;
  exr_decode_pipeline_t decoder;
  undefined8 local_300;
  int local_2f4;
  undefined1 local_2f0 [4];
  int local_2ec;
  int local_2e4;
  long local_2e0;
  ostream local_2d8 [22];
  char local_2c2;
  char local_2c1;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long *local_298 [2];
  long local_288 [2];
  undefined8 local_278;
  code *pcStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 *local_210;
  short local_208;
  long local_1b0;
  long local_1a0;
  
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  local_228 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_218 = 0;
  local_278 = 0x68;
  uStack_220 = 0xbf800000fffffffe;
  pcStack_270 = err_cb;
  std::__cxx11::string::append((char *)local_298);
  iVar1 = exr_start_read(&local_300,local_298[0],&local_278);
  if (iVar1 == 0) {
    iVar1 = exr_get_chunk_count(0,0,&local_2f4);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 != (char *)0x0) goto LAB_00141dc6;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141ddc;
    }
    iVar1 = exr_get_chunk_count(local_300,0xffffffff,&local_2f4);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142c12;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142c28;
    }
    iVar1 = exr_get_chunk_count(local_300,0xb,&local_2f4);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142c67;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142c7d;
    }
    iVar1 = exr_get_chunk_count(local_300,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142cbc;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142cd2;
    }
    iVar1 = exr_get_chunk_count(local_300,0,&local_2f4);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0xef,0x1854bb,(char *)in_RCX);
LAB_00142023:
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
LAB_00142039:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(2);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142d11;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142d27;
    }
    iVar1 = exr_get_scanlines_per_chunk(0,0,&local_2f4);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 != (char *)0x0) goto LAB_00142023;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142039;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_300,0xffffffff,&local_2f4);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142d66;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142d7c;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_300,0xb,&local_2f4);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142dbb;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142dd1;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_300,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142e10;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142e26;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_300,0,&local_2f4);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0xfc,0x1854bb,
                     (char *)in_RCX);
LAB_00142280:
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
LAB_00142296:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(2);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142e65;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142e7b;
    }
    if (local_2f4 != 1) {
      core_test_fail("ccount == 1",(char *)0xfd,0x1854bb,(char *)in_RCX);
      iVar1 = 0;
LAB_00141261:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 != (char *)0x0) goto LAB_00142280;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142296;
    }
    iVar1 = exr_get_data_window(0,0,local_2f0);
    if (iVar1 != 2) goto LAB_00141261;
    iVar1 = exr_get_data_window(local_300,0xffffffff,local_2f0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142eba;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142ed0;
    }
    iVar1 = exr_get_data_window(local_300,1,local_2f0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142f0f;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142f25;
    }
    iVar1 = exr_get_data_window(local_300,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142f64;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142f7a;
    }
    iVar1 = exr_get_data_window(local_300,0,local_2f0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_data_window (f, 0, &dw)",(char *)0x108,0x1854bb,(char *)in_RCX);
LAB_001424dd:
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
LAB_001424f3:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(2);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00142fb9;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142fcf;
    }
    in_RCX = local_2d8;
    iVar1 = exr_read_scanline_chunk_info(0,0,0x2a);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 != (char *)0x0) goto LAB_001424dd;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001424f3;
    }
    in_RCX = local_2d8;
    iVar1 = exr_read_scanline_chunk_info(local_300,0xffffffff,0x2a);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0014300e;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143024;
    }
    poVar2 = local_2d8;
    in_RCX = poVar2;
    iVar1 = exr_read_scanline_chunk_info(local_300,1,0x2a);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00143063;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143079;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_read_scanline_chunk_info(local_300,0,0x2a);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_001430b8;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001430ce;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_300,0,4,2,0,0,poVar2);
    if (iVar1 != 0x13) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(0x13);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0014310d;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143123;
    }
    in_RCX = local_2d8;
    iVar1 = exr_read_scanline_chunk_info(local_300,0,local_2ec + -1);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar5 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00143162;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143178;
    }
    in_RCX = local_2d8;
    iVar1 = exr_read_scanline_chunk_info(local_300,0,local_2e4 + 1);
    if (iVar1 == 3) {
      in_RCX = local_2d8;
      iVar1 = exr_read_scanline_chunk_info(local_300,0,local_2ec);
      if (iVar1 == 0) {
        local_2e0 = 0;
        iVar1 = exr_get_chunk_unpacked_size(local_300,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          unaff_R14 = (ostream *)exr_get_default_error_message(iVar1);
          if (unaff_R14 != (ostream *)0x0) goto LAB_001428c0;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_001428d6;
        }
        if (local_2c2 != '\0') {
          pcVar5 = (char *)0x126;
          pcVar6 = "cinfo.type == EXR_STORAGE_SCANLINE";
LAB_001418b7:
          core_test_fail(pcVar6,pcVar5,0x1854bb,(char *)in_RCX);
          iVar1 = 0;
LAB_001418c3:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          unaff_R14 = (ostream *)exr_get_default_error_message(iVar1);
          if (unaff_R14 != (ostream *)0x0) goto LAB_00142915;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_0014292b;
        }
        if (local_2c1 != '\0') {
          pcVar5 = (char *)0x127;
          pcVar6 = "cinfo.compression == EXR_COMPRESSION_NONE";
          goto LAB_001418b7;
        }
        if (local_2b8 != local_2e0) {
          pcVar5 = (char *)0x128;
          pcVar6 = "cinfo.packed_size == pchunksz";
          goto LAB_001418b7;
        }
        if (local_2b0 != local_2e0) {
          pcVar5 = (char *)0x129;
          pcVar6 = "cinfo.unpacked_size == pchunksz";
          goto LAB_001418b7;
        }
        if (local_2a8 != 0) {
          pcVar5 = (char *)0x12a;
          pcVar6 = "cinfo.sample_count_data_offset == 0";
          goto LAB_001418b7;
        }
        if (local_2a0 != 0) {
          pcVar5 = (char *)0x12b;
          pcVar6 = "cinfo.sample_count_table_size == 0";
          goto LAB_001418b7;
        }
        in_RCX = (ostream *)&local_210;
        iVar1 = exr_decoding_initialize(local_300,0,local_2d8);
        if (iVar1 != 0) goto LAB_001418c3;
        if (local_208 != 2) {
          pcVar5 = (char *)0x130;
          pcVar6 = "decoder.channel_count == 2";
LAB_00141a10:
          core_test_fail(pcVar6,pcVar5,0x1854bb,(char *)in_RCX);
          iVar1 = 0;
LAB_00141a1c:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_0014296a;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_00142980;
        }
        iVar1 = strcmp((char *)*local_210,"R");
        if (iVar1 != 0) {
          pcVar5 = (char *)0x131;
          pcVar6 = "!strcmp (decoder.channels[0].channel_name, \"R\")";
          goto LAB_00141a10;
        }
        if (*(char *)((long)local_210 + 0x19) != '\x02') {
          pcVar5 = (char *)0x132;
          pcVar6 = "decoder.channels[0].bytes_per_element == 2";
          goto LAB_00141a10;
        }
        if (*(short *)((long)local_210 + 0x1a) != 1) {
          pcVar5 = (char *)0x133;
          pcVar6 = "decoder.channels[0].data_type == EXR_PIXEL_HALF";
          goto LAB_00141a10;
        }
        if (*(int *)((long)local_210 + 0xc) != 0xb2) {
          pcVar5 = (char *)0x134;
          pcVar6 = "decoder.channels[0].width == 178";
          goto LAB_00141a10;
        }
        if (*(int *)(local_210 + 1) != 1) {
          pcVar5 = (char *)0x135;
          pcVar6 = "decoder.channels[0].height == 1";
          goto LAB_00141a10;
        }
        if (*(int *)(local_210 + 2) != 1) {
          pcVar5 = (char *)0x136;
          pcVar6 = "decoder.channels[0].x_samples == 1";
          goto LAB_00141a10;
        }
        if (*(int *)((long)local_210 + 0x14) != 1) {
          pcVar5 = (char *)0x137;
          pcVar6 = "decoder.channels[0].y_samples == 1";
          goto LAB_00141a10;
        }
        iVar1 = strcmp((char *)local_210[6],"Z");
        if (iVar1 != 0) {
          pcVar5 = (char *)0x138;
          pcVar6 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
          goto LAB_00141a10;
        }
        if (*(char *)((long)local_210 + 0x49) != '\x04') {
          pcVar5 = (char *)0x139;
          pcVar6 = "decoder.channels[1].bytes_per_element == 4";
          goto LAB_00141a10;
        }
        if (*(short *)((long)local_210 + 0x4a) != 2) {
          pcVar5 = (char *)0x13a;
          pcVar6 = "decoder.channels[1].data_type == EXR_PIXEL_FLOAT";
          goto LAB_00141a10;
        }
        if (*(int *)((long)local_210 + 0x3c) != 0xb2) {
          pcVar5 = (char *)0x13b;
          pcVar6 = "decoder.channels[1].width == 178";
          goto LAB_00141a10;
        }
        if (*(int *)(local_210 + 7) != 1) {
          pcVar5 = (char *)0x13c;
          pcVar6 = "decoder.channels[1].height == 1";
          goto LAB_00141a10;
        }
        if (*(int *)(local_210 + 8) != 1) {
          pcVar5 = (char *)0x13d;
          pcVar6 = "decoder.channels[1].x_samples == 1";
          goto LAB_00141a10;
        }
        if (*(int *)((long)local_210 + 0x44) != 1) {
          pcVar5 = (char *)0x13e;
          pcVar6 = "decoder.channels[1].y_samples == 1";
          goto LAB_00141a10;
        }
        unaff_R14 = (ostream *)operator_new__(0x164);
        poVar2 = (ostream *)operator_new__(0x2c8);
        memset(unaff_R14,0xff,0x164);
        memset(poVar2,0xff,0x2c8);
        local_210[5] = unaff_R14;
        in_RCX = (ostream *)0x16400000002;
        local_210[4] = 0x16400000002;
        local_210[0xb] = poVar2;
        local_210[10] = 0x2c800000004;
        iVar1 = exr_decoding_choose_default_routines(local_300,0);
        if (iVar1 != 0) goto LAB_00141a1c;
        iVar1 = exr_decoding_run(local_300,0,&local_210);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_001429bf;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_001429d5;
        }
        if (local_1b0 != 0) {
          pcVar5 = (char *)0x150;
          pcVar6 = "decoder.packed_buffer == __null";
LAB_00141b14:
          core_test_fail(pcVar6,pcVar5,0x1854bb,(char *)in_RCX);
LAB_00141b20:
          pcVar5 = (char *)0x156;
          pcVar6 = "*curr == 0";
LAB_00141b3a:
          core_test_fail(pcVar6,pcVar5,0x1854bb,(char *)in_RCX);
          iVar1 = 0;
LAB_00141b46:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_00142a14;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_00142a2a;
        }
        if (local_1a0 != 0) {
          pcVar5 = (char *)0x152;
          pcVar6 = "decoder.unpacked_buffer == __null";
          goto LAB_00141b14;
        }
        if (*(short *)unaff_R14 != 0) goto LAB_00141b20;
        if (1e-06 <= ABS(*(float *)poVar2 + -0.101991)) {
          pcVar5 = (char *)0x157;
          pcVar6 = "fabsf (*curz - 0.101991f) < 0.000001f";
          goto LAB_00141b3a;
        }
        iVar1 = exr_decoding_destroy(local_300,&local_210);
        if (iVar1 != 0) goto LAB_00141b46;
        in_RCX = (ostream *)&local_210;
        iVar1 = exr_decoding_initialize(local_300,0,local_2d8);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_00142a69;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_00142a7f;
        }
        pvVar3 = operator_new__(0x2c8);
        operator_delete__(unaff_R14);
        local_210[5] = pvVar3;
        *(undefined4 *)((long)local_210 + 0x24) = 0x2c8;
        in_RCX = (ostream *)0x400020004;
        *(undefined8 *)((long)local_210 + 0x1c) = 0x400020004;
        local_210[0xb] = poVar2;
        local_210[10] = 0x2c800000004;
        iVar1 = exr_decoding_choose_default_routines(local_300,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_00142abe;
          std::ios::clear((int)unaff_R14 + (int)*(undefined8 *)(*(long *)unaff_R14 + -0x18));
          goto LAB_00142ad4;
        }
        iVar1 = exr_decoding_run(local_300,0,&local_210);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_00142b13;
          std::ios::clear((int)unaff_R14 + (int)*(undefined8 *)(*(long *)unaff_R14 + -0x18));
          goto LAB_00142b29;
        }
        iVar1 = exr_decoding_destroy(local_300,&local_210);
        if (iVar1 == 0) {
          exr_finish(&local_300);
          operator_delete__(poVar2);
          operator_delete__(pvVar3);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0],local_288[0] + 1);
          }
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        unaff_R14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,") ",2);
        unaff_R12 = (char *)exr_get_default_error_message(iVar1);
        if (unaff_R12 != (char *)0x0) goto LAB_00142b68;
        std::ios::clear((int)unaff_R14 + (int)*(undefined8 *)(*(long *)unaff_R14 + -0x18));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        unaff_R14 = (ostream *)exr_get_default_error_message(iVar1);
        if (unaff_R14 == (ostream *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar4 = strlen((char *)unaff_R14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.min.y, &cinfo)",(char *)0x122,
                       0x1854bb,(char *)in_RCX);
LAB_001428c0:
        sVar4 = strlen((char *)unaff_R14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_001428d6:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x125,0x1854bb,
                       (char *)in_RCX);
LAB_00142915:
        sVar4 = strlen((char *)unaff_R14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_0014292b:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x12e,0x1854bb,
                       (char *)in_RCX);
LAB_0014296a:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar4);
LAB_00142980:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x14b,
                       0x1854bb,(char *)in_RCX);
LAB_001429bf:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar4);
LAB_001429d5:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x14d,0x1854bb,(char *)in_RCX);
LAB_00142a14:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar4);
LAB_00142a2a:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x159,0x1854bb,(char *)in_RCX);
LAB_00142a69:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar4);
LAB_00142a7f:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x15b,0x1854bb,
                       (char *)in_RCX);
LAB_00142abe:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,unaff_R12,sVar4);
LAB_00142ad4:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R14 + -0x18) + (char)unaff_R14);
        std::ostream::put((char)unaff_R14);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x166,
                       0x1854bb,(char *)in_RCX);
LAB_00142b13:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,unaff_R12,sVar4);
LAB_00142b29:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R14 + -0x18) + (char)unaff_R14);
        std::ostream::put((char)unaff_R14);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x168,0x1854bb,(char *)in_RCX);
LAB_00142b68:
        sVar4 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,unaff_R12,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R14 + -0x18) + (char)unaff_R14);
      std::ostream::put((char)unaff_R14);
      std::ostream::flush();
      core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x16a,0x1854bb,(char *)in_RCX);
      goto LAB_00142bbd;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    unaff_R14 = (ostream *)exr_get_default_error_message(3);
    if (unaff_R14 == (ostream *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001431cd;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xe4,0x1854bb,(char *)in_RCX);
LAB_00141dc6:
    sVar4 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar4);
LAB_00141ddc:
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    unaff_R14 = (ostream *)exr_get_default_error_message(2);
    if (unaff_R14 == (ostream *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
LAB_00142bbd:
      sVar4 = strlen((char *)unaff_R14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0xe8,0x1854bb,(char *)in_RCX);
LAB_00142c12:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142c28:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0xea,0x1854bb,(char *)in_RCX);
LAB_00142c67:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142c7d:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0xec,0x1854bb,(char *)in_RCX);
LAB_00142cbc:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142cd2:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0xee,0x1854bb,(char *)in_RCX);
LAB_00142d11:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142d27:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (__null, 0, &ccount)",(char *)0xf3,0x1854bb,
                   (char *)in_RCX);
LAB_00142d66:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142d7c:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, -1, &ccount)",(char *)0xf6,0x1854bb,
                   (char *)in_RCX);
LAB_00142dbb:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142dd1:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 11, &ccount)",(char *)0xf9,0x1854bb,
                   (char *)in_RCX);
LAB_00142e10:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142e26:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, __null)",(char *)0xfb,0x1854bb,(char *)in_RCX
                  );
LAB_00142e65:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142e7b:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (__null, 0, &dw)",(char *)0x101,0x1854bb,(char *)in_RCX);
LAB_00142eba:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142ed0:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, -1, &dw)",(char *)0x103,0x1854bb,(char *)in_RCX);
LAB_00142f0f:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142f25:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, 1, &dw)",(char *)0x105,0x1854bb,(char *)in_RCX);
LAB_00142f64:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142f7a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, 0, __null)",(char *)0x107,0x1854bb,(char *)in_RCX);
LAB_00142fb9:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00142fcf:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (__null, 0, 42, &cinfo)",(char *)0x10d,0x1854bb,
                   (char *)in_RCX);
LAB_0014300e:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00143024:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, -1, 42, &cinfo)",(char *)0x110,0x1854bb,
                   (char *)in_RCX);
LAB_00143063:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00143079:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 1, 42, &cinfo)",(char *)0x113,0x1854bb,
                   (char *)in_RCX);
LAB_001430b8:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_001430ce:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, __null)",(char *)0x116,0x1854bb,
                   (char *)in_RCX);
LAB_0014310d:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00143123:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x11a,0x1854bb,
                   (char *)in_RCX);
LAB_00143162:
    sVar4 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_00143178:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.min.y - 1, &cinfo)",(char *)0x11e,
                   0x1854bb,(char *)in_RCX);
  }
  sVar4 = strlen((char *)unaff_R14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)unaff_R14,sVar4);
LAB_001431cd:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.max.y + 1, &cinfo)",(char *)0x121,0x1854bb,
                 (char *)in_RCX);
  operator_delete__(unaff_R14);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}